

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

pair<int,_int> __thiscall imrt::Station::getPos(Station *this,int index)

{
  _Rb_tree_header *p_Var1;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *this_00;
  mapped_type mVar2;
  _Base_ptr p_Var3;
  pair<int,_int> pVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  mapped_type local_2c;
  
  p_Var7 = (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Base_ptr)0x0) {
    p_Var1 = &(this->beam2pos)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (index <= (int)p_Var7[1]._M_color) {
        p_Var3 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < index];
    } while (p_Var7 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && ((int)p_Var3[1]._M_color <= index)) {
      pmVar5 = (mapped_type *)&p_Var3[1].field_0x4;
      goto LAB_00115530;
    }
  }
  this_00 = &this->beam2pos;
  local_2c = index;
  pVar4 = Collimator::indexToPos(this->collimator,index,this->angle);
  pmVar5 = std::
           map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
           ::operator[](this_00,&local_2c);
  mVar2 = local_2c;
  pmVar5->first = pVar4.first;
  pmVar5->second = pVar4.second;
  pmVar5 = std::
           map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
           ::operator[](this_00,&local_2c);
  pmVar6 = std::
           map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
           ::operator[](&this->pos2beam,pmVar5);
  *pmVar6 = mVar2;
  pmVar5 = std::
           map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
           ::operator[](this_00,&local_2c);
LAB_00115530:
  pVar4.first = pmVar5->first;
  pVar4.second = pmVar5->second;
  return pVar4;
}

Assistant:

pair<int,int> Station::getPos(int index) const{
    auto pos = beam2pos.find(index);
    if(pos==beam2pos.end()){
      beam2pos[index]=collimator.indexToPos(index, angle);
      pos2beam[beam2pos[index]]=index;
      return beam2pos[index];
    }
    return(pos->second);
  }